

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_gif_out.c
# Opt level: O1

void gdImageGifAnimAddCtx
               (gdImagePtr im,gdIOCtxPtr out,int LocalCM,int LeftOfs,int TopOfs,int Delay,
               int Disposal,gdImagePtr previm)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  undefined2 uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int iVar8;
  gdImagePtr im_00;
  gdImagePtr to;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  gdImagePtr pgVar13;
  uint uVar14;
  ulong uVar15;
  byte bVar16;
  long lVar17;
  int local_c57c;
  int local_c560;
  gdImagePtr local_c550;
  int colorMap [256];
  
  iVar1 = im->interlace;
  local_c57c = im->transparent;
  if (im->trueColor == 0) {
    local_c550 = (gdImagePtr)0x0;
  }
  else {
    local_c550 = gdImageCreatePaletteFromTrueColor(im,1,0x100);
    im = local_c550;
    if (local_c550 == (gdImagePtr)0x0) {
      return;
    }
  }
  local_c560 = LeftOfs;
  if (previm != (gdImagePtr)0x0) {
    uVar14 = im->sy;
    if (previm->trueColor == 0) {
      im_00 = (gdImagePtr)0x0;
LAB_00117f86:
      lVar12 = 0;
      do {
        colorMap[lVar12] = -2;
        lVar12 = lVar12 + 1;
      } while (lVar12 != 0x100);
      if (0 < im->sy) {
        lVar12 = 0;
        do {
          if (0 < im->sx) {
            uVar15 = 0;
            do {
              iVar5 = comparewithmap(previm,im,(uint)previm->pixels[lVar12][uVar15],
                                     (uint)im->pixels[lVar12][uVar15],colorMap);
              if (iVar5 == 0) {
                uVar14 = (uint)lVar12;
                goto LAB_00118023;
              }
              uVar15 = uVar15 + 1;
            } while ((long)uVar15 < (long)im->sx);
          }
          lVar12 = lVar12 + 1;
        } while (lVar12 < im->sy);
      }
      uVar15 = 0;
      lVar12 = 0;
LAB_00118023:
      uVar6 = (uint)uVar15;
      local_c560 = 1;
      uVar9 = 0;
      iVar5 = 0;
      TopOfs = 1;
      iVar10 = 0;
      if (im->sy != uVar14) {
        lVar17 = (long)im->sy + -1;
        uVar9 = uVar6;
        iVar5 = (int)lVar12;
        if ((int)uVar14 < (int)lVar17) {
          do {
            if (0 < im->sx) {
              uVar11 = 0;
              do {
                iVar5 = comparewithmap(previm,im,(uint)previm->pixels[lVar17][uVar11],
                                       (uint)im->pixels[lVar17][uVar11],colorMap);
                if (iVar5 == 0) {
                  uVar9 = (uint)uVar11;
                  uVar2 = uVar15;
                  if (uVar6 < uVar9) {
                    uVar2 = uVar11;
                  }
                  if (uVar9 < uVar6) {
                    uVar6 = uVar9;
                  }
                  uVar15 = (ulong)uVar6;
                  lVar12 = lVar17;
                  uVar6 = (uint)uVar2;
                  goto LAB_001180c6;
                }
                uVar11 = uVar11 + 1;
              } while ((long)uVar11 < (long)im->sx);
            }
            lVar17 = lVar17 + -1;
          } while ((int)uVar14 < lVar17);
LAB_001180c6:
          uVar9 = uVar6;
          iVar5 = (int)lVar12;
        }
        if ((int)uVar15 < 1) {
          uVar11 = uVar15 & 0xffffffff;
        }
        else {
          uVar11 = 0;
          do {
            lVar12 = (long)(int)uVar14;
            iVar10 = (iVar5 - uVar14) + 1;
            if ((int)uVar14 <= iVar5) {
              do {
                iVar7 = comparewithmap(previm,im,(uint)previm->pixels[lVar12][uVar11],
                                       (uint)im->pixels[lVar12][uVar11],colorMap);
                if (iVar7 == 0) goto LAB_00118176;
                lVar12 = lVar12 + 1;
                iVar10 = iVar10 + -1;
              } while (iVar10 != 0);
            }
            uVar11 = uVar11 + 1;
          } while (uVar11 != (uVar15 & 0xffffffff));
          uVar11 = uVar15 & 0xffffffff;
        }
LAB_00118176:
        local_c560 = (int)uVar11;
        TopOfs = uVar14;
        iVar10 = local_c57c;
        if ((int)uVar9 < im->sx + -1) {
          lVar12 = (long)im->sx + -1;
          do {
            lVar17 = (long)(int)uVar14;
            iVar7 = uVar14 - 1;
            if ((int)uVar14 <= iVar5) {
              do {
                iVar8 = comparewithmap(previm,im,(uint)previm->pixels[lVar17][lVar12],
                                       (uint)im->pixels[lVar17][lVar12],colorMap);
                if (iVar8 == 0) {
                  uVar9 = (uint)lVar12;
                  goto LAB_00118241;
                }
                lVar17 = lVar17 + 1;
                iVar7 = iVar7 + 1;
              } while (iVar5 != iVar7);
            }
            lVar12 = lVar12 + -1;
          } while ((int)uVar9 < lVar12);
        }
      }
LAB_00118241:
      local_c57c = iVar10;
      if ((((local_c560 == 0) && (TopOfs == 0)) && (uVar9 == im->sx - 1U)) &&
         (local_c57c < 0 && iVar5 == im->sy + -1)) {
LAB_001182d2:
        if ((-1 < local_c57c) && (0 < im->sy)) {
          lVar12 = 0;
          do {
            if (0 < (long)im->sx) {
              lVar17 = 0;
              do {
                if (previm->pixels[lVar12 + TopOfs][lVar17 + local_c560] ==
                    im->pixels[lVar12][lVar17]) {
                  gdImageSetPixel(im,(int)lVar17,(int)lVar12,local_c57c);
                  break;
                }
                lVar17 = lVar17 + 1;
              } while (im->sx != lVar17);
            }
            lVar12 = lVar12 + 1;
          } while (lVar12 < im->sy);
        }
        bVar3 = false;
        if (im_00 != (gdImagePtr)0x0) {
          gdImageDestroy(im_00);
        }
      }
      else {
        iVar10 = (uVar9 - local_c560) + 1;
        iVar5 = (iVar5 - TopOfs) + 1;
        to = gdImageCreate(iVar10,iVar5);
        if (to == (gdImagePtr)0x0) {
          bVar3 = true;
          pgVar13 = im_00;
        }
        else {
          pgVar13 = im;
          if (LocalCM < 1) {
            pgVar13 = previm;
          }
          gdImagePaletteCopy(to,pgVar13);
          bVar3 = false;
          gdImageCopy(to,im,0,0,local_c560,TopOfs,iVar10,iVar5);
          pgVar13 = local_c550;
          local_c550 = to;
          im = to;
        }
        if (pgVar13 != (gdImagePtr)0x0) {
          gdImageDestroy(pgVar13);
        }
        if (to != (gdImagePtr)0x0) goto LAB_001182d2;
      }
      Disposal = 1;
    }
    else {
      im_00 = gdImageCreatePaletteFromTrueColor(previm,1,0x100);
      previm = im_00;
      if (im_00 != (gdImagePtr)0x0) goto LAB_00117f86;
      bVar3 = true;
    }
    if (bVar3) goto LAB_001186d1;
    if (bVar3) {
      return;
    }
  }
  iVar5 = im->colorsTotal;
  uVar14 = 1;
  if ((((2 < iVar5) && (uVar14 = 2, 4 < iVar5)) &&
      ((uVar14 = 3, 8 < iVar5 &&
       (((uVar14 = 4, 0x10 < iVar5 && (uVar14 = 5, 0x20 < iVar5)) && (uVar14 = 6, 0x40 < iVar5))))))
     && (uVar14 = 7, 0x80 < iVar5)) {
    uVar14 = (uint)(iVar5 < 0x101) << 3;
  }
  iVar5 = im->sx;
  iVar10 = im->sy;
  memset(colorMap,0,0xc4e0);
  uVar4 = (short)local_c560;
  if (local_c560 < 1) {
    uVar4 = 0;
  }
  if (TopOfs < 1) {
    TopOfs = 0;
  }
  iVar7 = 100;
  if (-1 < Delay) {
    iVar7 = Delay;
  }
  bVar16 = (char)Disposal * '\x04';
  colorMap._16_8_ = (long)iVar10 * (long)iVar5;
  colorMap[6] = 0;
  colorMap[2] = 0;
  colorMap[3] = 0;
  colorMap[0] = iVar5;
  colorMap[1] = iVar10;
  colorMap[7] = iVar1;
  gdPutC('!',out);
  gdPutC(0xf9,out);
  gdPutC('\x04',out);
  if (Disposal < 0) {
    bVar16 = 4;
  }
  gdPutC(bVar16 | (byte)~(byte)((uint)local_c57c >> 0x18) >> 7,out);
  gdPutC((uchar)iVar7,out);
  gdPutC((uchar)((uint)iVar7 >> 8),out);
  gdPutC((uchar)local_c57c,out);
  gdPutC('\0',out);
  gdPutC(',',out);
  gdPutC((uchar)uVar4,out);
  gdPutC((uchar)((ushort)uVar4 >> 8),out);
  gdPutC((uchar)TopOfs,out);
  gdPutC((uchar)((uint)TopOfs >> 8),out);
  iVar1 = colorMap[0];
  gdPutC((uchar)colorMap[0],out);
  gdPutC((uchar)((uint)iVar1 >> 8),out);
  iVar1 = colorMap[1];
  gdPutC((uchar)colorMap[1],out);
  gdPutC((uchar)((uint)iVar1 >> 8),out);
  uVar6 = uVar14 + 0x7f | 0x80;
  if (LocalCM < 1) {
    uVar6 = 0;
  }
  gdPutC((byte)uVar6 | (colorMap[7] != 0) << 6,out);
  if (0 < LocalCM) {
    lVar12 = 0;
    do {
      gdPutC((uchar)im->red[lVar12],out);
      gdPutC((uchar)im->green[lVar12],out);
      gdPutC((uchar)im->blue[lVar12],out);
      lVar12 = lVar12 + 1;
    } while ((uint)lVar12 >> (sbyte)uVar14 == 0);
  }
  uVar6 = 2;
  if (2 < uVar14) {
    uVar6 = uVar14;
  }
  gdPutC((uchar)uVar6,out);
  compress(uVar6 + 1,out,im,(GifCtx *)colorMap);
  gdPutC('\0',out);
LAB_001186d1:
  if (local_c550 != (gdImagePtr)0x0) {
    gdImageDestroy(local_c550);
  }
  return;
}

Assistant:

BGD_DECLARE(void) gdImageGifAnimAddCtx(gdImagePtr im, gdIOCtxPtr out,
                                       int LocalCM, int LeftOfs, int TopOfs,
                                       int Delay, int Disposal,
                                       gdImagePtr previm)
{
	gdImagePtr pim = NULL, tim = im;
	int interlace, transparent, BitsPerPixel;
	interlace = im->interlace;
	transparent = im->transparent;

	/* Default is no local color map */
	if(LocalCM < 0) {
		LocalCM = 0;
	}

	if(im->trueColor) {
		/* Expensive, but the only way that produces an
			acceptable result: mix down to a palette
			based temporary image. */
		pim = gdImageCreatePaletteFromTrueColor(im, 1, 256);
		if (!pim) {
			return;
		}
		tim = pim;
	}

	if (previm) {
		/* create optimized animation.  Compare this image to
		   the previous image and crop the temporary copy of
		   current image to include only changed rectangular
		   area.  Also replace unchanged pixels inside this
		   area with transparent color.  Transparent color
		   needs to be already allocated!
		   Preconditions:
		   TopOfs, LeftOfs are assumed 0

		   Images should be of same size.  If not, a temporary
		   copy is made with the same size as previous image.

		*/
		gdImagePtr prev_pim = 0, prev_tim = previm;
		int x, y;
		int min_x = 0;
		int min_y = tim->sy;
		int max_x = 0;
		int max_y = 0;
		int colorMap[256];

		if (previm->trueColor) {
			prev_pim = gdImageCreatePaletteFromTrueColor(previm, 1, 256);
			if (!prev_pim) {
				goto fail_end;
			}
			prev_tim = prev_pim;
		}

		for (x = 0; x < 256; ++x) {
			colorMap[x] = -2;
		}

		/* First find bounding box of changed areas. */
		/* first find the top changed row */
		for (y = 0; y < tim->sy; ++y) {
			for (x = 0; x < tim->sx; ++x) {
				if (!comparewithmap(prev_tim, tim,
				                    prev_tim->pixels[y][x],
				                    tim->pixels[y][x],
				                    colorMap)) {
					min_y = max_y = y;
					min_x = max_x = x;
					goto break_top;
				}
			}
		}

break_top:
		if (tim->sy == min_y) {
			/* No changes in this frame!! Encode empty image. */
			transparent = 0;
			min_x = min_y = 1;
			max_x = max_y = 0;
		} else {
			/* Then the bottom row */
			for (y = tim->sy - 1; y > min_y; --y) {
				for (x = 0; x < tim->sx; ++x) {
					if (!comparewithmap
					        (prev_tim, tim,
					         prev_tim->pixels[y][x],
					         tim->pixels[y][x],
					         colorMap)) {
						max_y = y;
						if(x < min_x) {
							min_x = x;
						}
						if(x > max_x) {
							max_x = x;
						}
						goto break_bot;
					}
				}
			}

break_bot:
			/* left side */
			for (x = 0; x < min_x; ++x) {
				for (y = min_y; y <= max_y; ++y) {
					if (!comparewithmap
					        (prev_tim, tim,
					         prev_tim->pixels[y][x],
					         tim->pixels[y][x],
					         colorMap)) {
						min_x = x;
						goto break_left;
					}
				}
			}

break_left:
			/* right side */
			for (x = tim->sx - 1; x > max_x; --x) {
				for (y = min_y; y <= max_y; ++y) {
					if (!comparewithmap
					        (prev_tim, tim,
					         prev_tim->pixels[y][x],
					         tim->pixels[y][x],
					         colorMap)) {
						max_x = x;
						goto break_right;
					}
				}
			}

break_right:
			;
		}

		LeftOfs = min_x;
		TopOfs = min_y;
		Disposal = 1;

		/* Make a copy of the image with the new offsets.
		   But only if necessary. */
		if (min_x != 0 || max_x != tim->sx - 1
		        || min_y != 0 || max_y != tim->sy - 1
		        || transparent >= 0) {

			gdImagePtr pim2 = gdImageCreate(max_x-min_x + 1, max_y-min_y + 1);

			if (!pim2) {
				if (prev_pim) {
					gdImageDestroy(prev_pim);
				}
				goto fail_end;
			}

			gdImagePaletteCopy(pim2, LocalCM ? tim : prev_tim);
			gdImageCopy(pim2, tim, 0, 0, min_x, min_y,
			            max_x - min_x + 1, max_y - min_y + 1);

			if (pim) {
				gdImageDestroy(pim);
			}

			tim = pim = pim2;
		}

		/* now let's compare pixels for transparent
		   optimization.  But only if transparent is set. */
		if (transparent >= 0) {
			for(y = 0; y < tim->sy; ++y) {
				for (x = 0; x < tim->sx; ++x) {
					if(comparewithmap
					        (prev_tim, tim,
					         prev_tim->pixels[min_y + y][min_x + x],
					         tim->pixels[y][x], 0)) {
						gdImageSetPixel(tim, x, y, transparent);
						break;
					}
				}
			}
		}

		if(prev_pim) {
			gdImageDestroy(prev_pim);
		}
	}

	BitsPerPixel = colorstobpp(tim->colorsTotal);

	/* All set, let's do it. */
	GIFAnimEncode(
	    out, tim->sx, tim->sy, LeftOfs, TopOfs, interlace, transparent,
	    Delay, Disposal, BitsPerPixel,
	    LocalCM ? tim->red : 0, tim->green, tim->blue, tim);

fail_end:
	if(pim) {
		/* Destroy palette based temporary image. */
		gdImageDestroy(pim);
	}
}